

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

bool __thiscall
QPlainTextEditControl::canInsertFromMimeData(QPlainTextEditControl *this,QMimeData *source)

{
  code *UNRECOVERED_JUMPTABLE;
  undefined1 uVar1;
  bool bVar2;
  QPlainTextEdit *pQVar3;
  undefined8 extraout_RDX;
  
  pQVar3 = QtPrivate::qobject_cast_helper<QPlainTextEdit*,QObject>
                     (*(QObject **)(*(long *)&(this->super_QWidgetTextControl).field_0x8 + 0x10));
  if (pQVar3 != (QPlainTextEdit *)0x0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1d8
                   );
    uVar1 = (*UNRECOVERED_JUMPTABLE)(pQVar3,source,extraout_RDX,UNRECOVERED_JUMPTABLE);
    return (bool)uVar1;
  }
  bVar2 = QWidgetTextControl::canInsertFromMimeData((QWidgetTextControl *)this,source);
  return bVar2;
}

Assistant:

bool QPlainTextEditControl::canInsertFromMimeData(const QMimeData *source) const {
    QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
    if (!ed)
        return QWidgetTextControl::canInsertFromMimeData(source);
    return ed->canInsertFromMimeData(source);
}